

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_perform_upgrade_tls(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  ulong in_RAX;
  byte bVar4;
  _Bool ssldone;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  _Var2 = Curl_conn_is_ssl(conn,0);
  if ((!_Var2) && (CVar3 = Curl_ssl_cfilter_add(data,conn,0), CVar3 != CURLE_OK)) {
    return CVar3;
  }
  CVar3 = Curl_conn_connect(data,0,false,(_Bool *)((long)&uStack_18 + 7));
  if (CVar3 == CURLE_OK) {
    bVar4 = *(byte *)((long)&conn->proto + 0xe2) & 0xfe | uStack_18._7_1_;
    *(byte *)((long)&conn->proto + 0xe2) = bVar4;
    if ((conn->proto).pop3c.state != POP3_UPGRADETLS) {
      (data->conn->proto).pop3c.state = POP3_UPGRADETLS;
      bVar4 = *(byte *)((long)&conn->proto + 0xe2);
    }
    CVar3 = CURLE_OK;
    if ((bVar4 & 1) != 0) {
      conn->handler = &Curl_handler_pop3s;
      puVar1 = &(conn->bits).field_0x3;
      *puVar1 = *puVar1 | 8;
      CVar3 = pop3_perform_capa(data,conn);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode pop3_perform_upgrade_tls(struct Curl_easy *data,
                                         struct connectdata *conn)
{
  /* Start the SSL connection */
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  CURLcode result;
  bool ssldone = FALSE;

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
    if(result)
      goto out;
  }

  result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);

  if(!result) {
    pop3c->ssldone = ssldone;
    if(pop3c->state != POP3_UPGRADETLS)
      pop3_state(data, POP3_UPGRADETLS);

    if(pop3c->ssldone) {
      pop3_to_pop3s(conn);
      result = pop3_perform_capa(data, conn);
    }
  }
out:
  return result;
}